

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_gc_mark_protected_WRAP(WorkerP *w,Task *__dq_head,TD_lddmc_gc_mark_protected *t)

{
  TD_lddmc_gc_mark_protected *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  lddmc_gc_mark_protected_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(lddmc_gc_mark_protected)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = protect_iter(&lddmc_protected, 0, lddmc_protected.refs_size);
    while (it != NULL) {
        MDD *to_mark = (MDD*)protect_next(&lddmc_protected, &it, lddmc_protected.refs_size);
        SPAWN(lddmc_gc_mark_rec, *to_mark);
        count++;
    }
    while (count--) {
        SYNC(lddmc_gc_mark_rec);
    }
}